

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_factory.h
# Opt level: O2

void __thiscall
linux_util::canvas_factory<(linux_util::screen_t)0>::vline
          (canvas_factory<(linux_util::screen_t)0> *this,size_t x,size_t y,size_t height)

{
  uint8_t *puVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = (this->vinfo).xres * y + x;
  puVar1 = this->screen1;
  while (bVar3 = height != 0, height = height - 1, bVar3) {
    *(pixel_t *)(puVar1 + lVar2 * 4) = this->colour;
    lVar2 = lVar2 + (ulong)(this->vinfo).xres;
  }
  return;
}

Assistant:

void vline(size_t x, size_t y, size_t height)  {
            y *= vinfo.xres;
            y += x;
            for(size_t i{0}; i < height; ++i) {
                ((pixel_t *) (screen1))[y] = colour;
                y += vinfo.xres;
            }
        }